

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task26.cpp
# Opt level: O1

void resize(IntArray *arr,int newSize)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < newSize) {
    uVar4 = (long)newSize * 4;
  }
  piVar2 = (int *)operator_new__(uVar4);
  uVar3 = arr->size;
  if (newSize <= arr->size) {
    uVar3 = newSize;
  }
  if (0 < (int)uVar3) {
    piVar1 = arr->data;
    uVar4 = 0;
    do {
      piVar2[uVar4] = piVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  if (arr->data != (int *)0x0) {
    operator_delete__(arr->data);
  }
  arr->data = piVar2;
  uVar3 = arr->size;
  if ((int)uVar3 < newSize) {
    memset(piVar2 + (int)uVar3,0,(ulong)(~uVar3 + newSize) * 4 + 4);
  }
  arr->size = newSize;
  return;
}

Assistant:

void resize(IntArray* arr, int newSize){
    int* new_arr = new int [newSize];
    for (int i = 0; i < min(newSize, arr->size); i++) new_arr[i] = arr->data[i];
    delete[]arr->data;
    arr->data = new_arr;
    if (newSize > arr->size) for (int i = arr->size; i < newSize; i++) arr->data[i] = 0;
    arr->size = newSize;
}